

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.h
# Opt level: O3

double __thiscall
imrt::Plan::incremental_eval(Plan *this,Station *station,int i,int j,double intensity)

{
  mapped_type mVar1;
  _List_node_base *p_Var2;
  mapped_type *pmVar3;
  _List_node_base *p_Var4;
  double dVar5;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  _List_node_base local_48;
  long local_38;
  key_type local_30;
  
  local_48._M_next = &local_48;
  local_38 = 0;
  local_30.second = j;
  local_30.first = i;
  local_48._M_prev = local_48._M_next;
  pmVar3 = std::
           map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
           ::operator[](&station->pos2beam,&local_30);
  mVar1 = *pmVar3;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(mapped_type *)&p_Var4[1]._M_next = mVar1;
  p_Var4[1]._M_prev = (_List_node_base *)intensity;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_38 = local_38 + 1;
  dVar5 = incremental_eval(this,station,
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )&local_48);
  p_Var4 = local_48._M_next;
  while (p_Var4 != &local_48) {
    p_Var2 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
              &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var2;
  }
  return dVar5;
}

Assistant:

double incremental_eval (Station& station, int i, int j, double intensity){
		list< pair< int, double > > diff;
		diff.push_back(make_pair(station.pos2beam[make_pair(i,j)],intensity));
		return incremental_eval (station, diff);
	}